

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O3

RPCHelpMan * wallet::bumpfee_helper(RPCHelpMan *__return_storage_ptr__,string *method_name)

{
  RPCHelpMan *pRVar1;
  pointer pcVar2;
  size_type *psVar3;
  ulong *puVar4;
  string name;
  string name_00;
  string name_01;
  string name_02;
  string default_info;
  string name_03;
  string name_04;
  string name_05;
  string name_06;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string name_07;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  undefined1 auVar5 [16];
  Fallback fallback;
  Fallback fallback_00;
  Fallback fallback_01;
  Fallback fallback_02;
  Fallback fallback_03;
  Fallback fallback_04;
  Fallback fallback_05;
  Fallback fallback_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  string description_14;
  vector<RPCArg,_std::allocator<RPCArg>_> inner_06;
  vector<RPCArg,_std::allocator<RPCArg>_> inner_07;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  RPCArgOptions opts_01;
  RPCArgOptions opts_02;
  RPCArgOptions opts_03;
  RPCArgOptions opts_04;
  int iVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  long *plVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  char *pcVar11;
  char *pcVar12;
  undefined8 uVar13;
  long *plVar14;
  RPCResult *arg;
  long lVar15;
  long in_FS_OFFSET;
  bool bVar16;
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  undefined8 in_stack_ffffffffffffe4b8;
  undefined1 *puVar17;
  undefined8 in_stack_ffffffffffffe4c0;
  undefined4 in_stack_ffffffffffffe4c8;
  undefined4 uVar18;
  undefined8 in_stack_ffffffffffffe4d0;
  undefined1 in_stack_ffffffffffffe4d8;
  undefined7 in_stack_ffffffffffffe4d9;
  undefined8 in_stack_ffffffffffffe4e0;
  undefined8 in_stack_ffffffffffffe4e8;
  code *pcVar19;
  undefined8 in_stack_ffffffffffffe4f0;
  undefined1 in_stack_ffffffffffffe4f8 [16];
  pointer in_stack_ffffffffffffe508;
  pointer pRVar20;
  pointer in_stack_ffffffffffffe510;
  pointer pRVar21;
  pointer in_stack_ffffffffffffe518;
  pointer pRVar22;
  pointer in_stack_ffffffffffffe520;
  undefined1 in_stack_ffffffffffffe528 [16];
  pointer in_stack_ffffffffffffe538;
  pointer pRVar23;
  pointer in_stack_ffffffffffffe540;
  pointer pRVar24;
  pointer in_stack_ffffffffffffe548;
  undefined8 in_stack_ffffffffffffe550;
  pointer in_stack_ffffffffffffe558;
  pointer in_stack_ffffffffffffe560;
  pointer in_stack_ffffffffffffe568;
  RPCResult *in_stack_ffffffffffffe570;
  RPCResult *in_stack_ffffffffffffe578;
  pointer in_stack_ffffffffffffe580;
  pointer in_stack_ffffffffffffe588;
  pointer in_stack_ffffffffffffe590;
  pointer in_stack_ffffffffffffe598;
  allocator_type local_1a59;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1a58;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1a38;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1a18;
  RPCResults local_1a00;
  allocator_type local_19e2;
  allocator_type local_19e1;
  vector<RPCArg,_std::allocator<RPCArg>_> local_19e0;
  bool local_19c1;
  vector<RPCArg,_std::allocator<RPCArg>_> local_19c0;
  vector<RPCArg,_std::allocator<RPCArg>_> local_19a8;
  string local_1990;
  string local_1970;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1950;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1930;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1910;
  ulong *local_18f0;
  undefined8 local_18e8;
  ulong local_18e0;
  undefined8 uStack_18d8;
  ulong *local_18d0;
  size_type local_18c8;
  ulong local_18c0;
  undefined8 uStack_18b8;
  long *local_18b0 [2];
  long local_18a0 [2];
  long *local_1890 [2];
  long local_1880 [2];
  RPCResult local_1870;
  long *local_17e8 [2];
  long local_17d8 [2];
  long *local_17c8 [2];
  long local_17b8 [2];
  long *local_17a8 [2];
  long local_1798 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_1788;
  long *local_1768 [2];
  long local_1758 [2];
  pointer local_1748 [2];
  undefined1 local_1738 [152];
  RPCResult local_16a0;
  RPCResult local_1618;
  long *local_1590 [2];
  long local_1580 [2];
  long *local_1570 [2];
  long local_1560 [2];
  long *local_1550 [2];
  long local_1540 [2];
  long *local_1530 [2];
  long local_1520 [2];
  RPCResult local_1510;
  long *local_1488 [2];
  long local_1478 [2];
  long *local_1468 [2];
  long local_1458 [2];
  RPCResult local_1448;
  undefined1 local_13c0 [8];
  long *local_13b8 [2];
  long local_13a8 [2];
  undefined1 local_1398 [32];
  undefined1 local_1378;
  undefined1 *local_1370;
  undefined8 local_1368;
  undefined1 local_1360;
  undefined7 uStack_135f;
  undefined1 local_1350 [32];
  long *local_1330 [2];
  long local_1320 [2];
  uint *local_1310;
  undefined8 local_1308;
  uint local_1300;
  undefined4 uStack_12fc;
  undefined4 uStack_12f8;
  undefined4 uStack_12f4;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_12f0;
  undefined1 local_1298;
  long *local_1290 [2];
  long local_1280 [2];
  undefined1 local_1270 [8];
  undefined1 *local_1268;
  undefined8 local_1260;
  undefined1 local_1258;
  undefined7 uStack_1257;
  undefined1 local_1248 [32];
  long *local_1228 [2];
  long local_1218 [2];
  undefined1 *local_1208;
  undefined8 local_1200;
  undefined1 local_11f8;
  uint7 uStack_11f7;
  undefined8 uStack_11f0;
  undefined4 local_11e8;
  long *local_11e0;
  undefined8 local_11d8;
  long local_11d0;
  undefined8 uStack_11c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_11c0;
  vector<UniValue,_std::allocator<UniValue>_> local_11a8;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_1190;
  undefined1 local_1138;
  long *local_1130 [2];
  long local_1120 [2];
  undefined1 local_1110;
  undefined1 *local_1108;
  undefined8 local_1100;
  undefined1 local_10f8;
  undefined7 uStack_10f7;
  undefined1 local_10e8 [32];
  long *local_10c8 [2];
  long local_10b8 [2];
  string local_10a8;
  size_type *local_1088;
  size_type local_1080;
  size_type local_1078;
  undefined8 uStack_1070;
  UniValue local_1068;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_1010;
  undefined1 local_fb8;
  long *local_fb0 [2];
  long local_fa0 [2];
  undefined1 local_f90;
  undefined1 *local_f88;
  undefined8 local_f80;
  undefined1 local_f78;
  undefined7 uStack_f77;
  undefined1 local_f68 [32];
  long *local_f48 [2];
  long local_f38 [2];
  UniValue local_f28;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_ed0;
  undefined1 local_e78;
  long *local_e70 [2];
  long local_e60 [2];
  undefined1 local_e50;
  undefined1 *local_e48;
  undefined8 local_e40;
  undefined1 local_e38;
  undefined7 uStack_e37;
  undefined1 local_e28 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_de8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_da8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d48;
  size_type *local_d28;
  size_type local_d20;
  size_type local_d18;
  undefined8 uStack_d10;
  undefined1 *local_d08;
  undefined8 local_d00;
  undefined1 local_cf8;
  undefined7 uStack_cf7;
  undefined8 uStack_cf0;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_ce8;
  undefined1 local_c90;
  long *local_c88 [2];
  long local_c78 [2];
  undefined1 local_c68 [8];
  undefined1 *local_c60;
  long local_c58;
  undefined1 local_c50;
  undefined7 uStack_c4f;
  undefined1 local_c40 [24];
  undefined1 auStack_c28 [8];
  long *local_c20;
  long local_c10 [2];
  uint *local_c00;
  undefined8 local_bf8;
  uint local_bf0;
  undefined4 uStack_bec;
  undefined4 uStack_be8;
  undefined4 uStack_be4;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_be0;
  undefined1 local_b88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b60 [16];
  RPCArg local_a58;
  RPCArg local_950;
  RPCArg local_848;
  RPCArg local_740;
  RPCArg local_638;
  long *local_530 [2];
  long local_520 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_510;
  undefined1 local_4b8;
  long *local_4b0 [2];
  long local_4a0 [2];
  undefined1 local_490;
  vector<RPCArg,_std::allocator<RPCArg>_> local_488;
  undefined1 auStack_470 [8];
  undefined1 local_468 [32];
  long *local_448 [2];
  long local_438 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_428;
  undefined1 local_3d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8 [16];
  RPCArg local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  size_type *local_98;
  size_type local_90;
  size_type local_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  _Any_data local_78;
  _Manager_type local_68 [2];
  string incremental_fee;
  
  local_1068.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pRVar1 = *(RPCHelpMan **)(in_FS_OFFSET + 0x28);
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (method_name,"psbtbumpfee");
  bVar16 = iVar6 == 0;
  local_b60[0]._M_allocated_capacity = 1000;
  local_3a8[0]._M_allocated_capacity._0_4_ = 4;
  CFeeRate::ToString_abi_cxx11_
            (&incremental_fee,(CFeeRate *)&local_b60[0]._M_allocated_capacity,
             (FeeEstimateMode *)&local_3a8[0]._M_allocated_capacity);
  local_78._M_unused._M_object = local_68;
  pcVar2 = (method_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar2,pcVar2 + method_name->_M_string_length);
  pcVar12 = "";
  if (iVar6 == 0) {
    pcVar12 = "Returns a PSBT instead of creating and signing a new transaction.\n";
  }
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  pcVar11 = pcVar12 + 0x42;
  if (iVar6 != 0) {
    pcVar11 = pcVar12;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,pcVar12,pcVar11);
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_198,0,0,
                      "\nBumps the fee of an opt-in-RBF transaction T, replacing it with a new transaction B.\n"
                      ,0x56);
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar7->_M_dataplus)._M_p;
  paVar9 = &pbVar7->field_2;
  if (paVar10 == paVar9) {
    local_178.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_178.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_178.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_178._M_dataplus._M_p = (pointer)paVar10;
  }
  local_178._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_178,
                      "An opt-in RBF transaction with the given txid must be in the wallet.\nThe command will pay the additional fee by reducing change outputs or adding inputs when necessary.\nIt may add a new change output if one does not already exist.\nAll inputs in the original transaction will be included in the replacement transaction.\nThe command will fail if the wallet or mempool contains a transaction that spends one of T\'s outputs.\nBy default, the new fee will be calculated automatically using the estimatesmartfee RPC.\nThe user can specify a confirmation target for estimatesmartfee.\nAlternatively, the user can specify a fee rate in "
                     );
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar7->_M_dataplus)._M_p;
  paVar9 = &pbVar7->field_2;
  if (paVar10 == paVar9) {
    local_158.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_158.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_158.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_158._M_dataplus._M_p = (pointer)paVar10;
  }
  local_158._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_158,::CURRENCY_ATOM_abi_cxx11_._M_dataplus._M_p,
                     ::CURRENCY_ATOM_abi_cxx11_._M_string_length);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar7->_M_dataplus)._M_p;
  paVar9 = &pbVar7->field_2;
  if (paVar10 == paVar9) {
    local_138.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_138.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_138.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_138._M_dataplus._M_p = (pointer)paVar10;
  }
  local_138._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_138,
                      "/vB for the new transaction.\nAt a minimum, the new fee rate must be high enough to pay an additional new relay fee (incrementalfee\nreturned by getnetworkinfo) to enter the node\'s mempool.\n* WARNING: before version 0.21, fee_rate was in "
                     );
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar7->_M_dataplus)._M_p;
  paVar9 = &pbVar7->field_2;
  if (paVar10 == paVar9) {
    local_118.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_118.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_118.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_118._M_dataplus._M_p = (pointer)paVar10;
  }
  local_118._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_118,::CURRENCY_UNIT_abi_cxx11_._M_dataplus._M_p,
                     ::CURRENCY_UNIT_abi_cxx11_._M_string_length);
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar7->_M_dataplus)._M_p;
  paVar9 = &pbVar7->field_2;
  if (paVar10 == paVar9) {
    local_f8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_f8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_f8._M_dataplus._M_p = (pointer)paVar10;
  }
  local_f8._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_f8,"/kvB. As of 0.21, fee_rate is in ");
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar7->_M_dataplus)._M_p;
  paVar9 = &pbVar7->field_2;
  if (paVar10 == paVar9) {
    local_d8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_d8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_d8._M_dataplus._M_p = (pointer)paVar10;
  }
  local_d8._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_d8,::CURRENCY_ATOM_abi_cxx11_._M_dataplus._M_p,
                     ::CURRENCY_ATOM_abi_cxx11_._M_string_length);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar7->_M_dataplus)._M_p;
  paVar9 = &pbVar7->field_2;
  if (paVar10 == paVar9) {
    local_b8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_b8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_b8._M_dataplus._M_p = (pointer)paVar10;
  }
  local_b8._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_b8,"/vB. *\n");
  local_98 = &local_88;
  psVar3 = (size_type *)(pbVar7->_M_dataplus)._M_p;
  paVar10 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3 == paVar10) {
    local_88 = paVar10->_M_allocated_capacity;
    uStack_80 = *(undefined4 *)((long)&pbVar7->field_2 + 8);
    uStack_7c = *(undefined4 *)((long)&pbVar7->field_2 + 0xc);
  }
  else {
    local_88 = paVar10->_M_allocated_capacity;
    local_98 = psVar3;
  }
  local_90 = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  local_3c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_3c8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"txid","");
  local_428._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_3d0 = 0;
  local_448[0] = local_438;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"The txid to be bumped","");
  local_488.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((long)&local_488.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl
                      + 0x10);
  local_490 = 0;
  local_488.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_488.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_468._0_8_ = (pointer)0x0;
  local_468._8_2_ = 0;
  local_468._10_6_ = 0;
  local_468._16_2_ = 0;
  local_468._18_8_ = 0;
  name._M_string_length = in_stack_ffffffffffffe4c0;
  name._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe4b8;
  name.field_2._M_allocated_capacity._0_4_ = in_stack_ffffffffffffe4c8;
  name.field_2._M_allocated_capacity._4_4_ = iVar6;
  name.field_2._8_8_ = in_stack_ffffffffffffe4d0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _1_7_ = in_stack_ffffffffffffe4d9;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _M_first._M_storage._0_1_ = in_stack_ffffffffffffe4d8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe4e0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe4e8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe4f0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffe4f8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe508;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe510;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe518;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe520;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffe528;
  description_07._M_string_length = (size_type)in_stack_ffffffffffffe540;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe538;
  description_07.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe548;
  description_07.field_2._8_8_ = in_stack_ffffffffffffe550;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe560;
  opts._0_8_ = in_stack_ffffffffffffe558;
  opts.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe568;
  opts.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe570;
  opts.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe578;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe580;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe588;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe590;
  opts._64_8_ = in_stack_ffffffffffffe598;
  ::RPCArg::RPCArg((RPCArg *)local_3a8,name,(Type)&local_3c8,fallback,description_07,opts);
  local_4b0[0] = local_4a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"options","");
  local_510._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_4b8 = 0;
  local_530[0] = local_520;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_530,"");
  local_b80.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_b80.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b80,"conf_target","");
  local_c00 = &local_bf0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c00,"wallet -txconfirmtarget","")
  ;
  local_be0._0_8_ = (long)&local_be0 + 0x10;
  if (local_c00 == &local_bf0) {
    local_be0._24_4_ = uStack_be8;
    local_be0._28_4_ = uStack_be4;
  }
  else {
    local_be0._0_8_ = local_c00;
  }
  local_be0._8_8_ = local_bf8;
  local_bf8 = 0;
  local_bf0 = local_bf0 & 0xffffff00;
  local_b88 = 1;
  local_c20 = local_c10;
  local_c00 = &local_bf0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c20,"Confirmation target in blocks\n","");
  local_c60 = &local_c50;
  local_c68[0] = 0;
  local_c58 = 0;
  local_c50 = 0;
  local_c40._0_8_ = (pointer)0x0;
  local_c40._8_2_ = 0;
  local_c40._10_6_ = 0;
  local_c40._16_2_ = 0;
  stack0xfffffffffffff3d2 = 0;
  name_00._M_string_length = (size_type)method_name;
  name_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe4b8;
  name_00.field_2._M_allocated_capacity._0_4_ = in_stack_ffffffffffffe4c8;
  name_00.field_2._M_allocated_capacity._4_4_ = iVar6;
  name_00.field_2._8_8_ = in_stack_ffffffffffffe4d0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _1_7_ = in_stack_ffffffffffffe4d9;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _M_first._M_storage._0_1_ = in_stack_ffffffffffffe4d8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe4e0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe4e8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe4f0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffe4f8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe508;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe510;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe518;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe520;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffe528;
  description_08._M_string_length = (size_type)in_stack_ffffffffffffe540;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe538;
  description_08.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe548;
  description_08.field_2._8_8_ = in_stack_ffffffffffffe550;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe560;
  opts_00._0_8_ = in_stack_ffffffffffffe558;
  opts_00.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe568;
  opts_00.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe570;
  opts_00.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe578;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe580;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe588;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe590;
  opts_00._64_8_ = in_stack_ffffffffffffe598;
  ::RPCArg::RPCArg((RPCArg *)local_b60,name_00,(Type)&local_b80,fallback_00,description_08,opts_00);
  local_c88[0] = local_c78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c88,"fee_rate","");
  local_d08 = &local_cf8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d08,"not set, fall back to wallet fee estimation","");
  local_ce8._0_8_ = (long)&local_ce8 + 0x10;
  if (local_d08 == &local_cf8) {
    local_ce8._24_8_ = uStack_cf0;
  }
  else {
    local_ce8._0_8_ = local_d08;
  }
  local_ce8._8_8_ = local_d00;
  local_d00 = 0;
  local_cf8 = 0;
  local_c90 = 1;
  local_d08 = &local_cf8;
  std::operator+(&local_e08,"\nSpecify a fee rate in ",&::CURRENCY_ATOM_abi_cxx11_);
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_e08,
                      "/vB instead of relying on the built-in fee estimator.\nMust be at least ");
  local_de8._M_dataplus._M_p = (pointer)&local_de8.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar7->_M_dataplus)._M_p;
  paVar9 = &pbVar7->field_2;
  if (paVar10 == paVar9) {
    local_de8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_de8.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_de8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_de8._M_dataplus._M_p = (pointer)paVar10;
  }
  local_de8._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_de8,incremental_fee._M_dataplus._M_p,incremental_fee._M_string_length);
  local_dc8._M_dataplus._M_p = (pointer)&local_dc8.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar7->_M_dataplus)._M_p;
  paVar9 = &pbVar7->field_2;
  if (paVar10 == paVar9) {
    local_dc8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_dc8.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_dc8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_dc8._M_dataplus._M_p = (pointer)paVar10;
  }
  local_dc8._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_dc8,
                      " higher than the current transaction fee rate.\nWARNING: before version 0.21, fee_rate was in "
                     );
  local_da8._M_dataplus._M_p = (pointer)&local_da8.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar7->_M_dataplus)._M_p;
  paVar9 = &pbVar7->field_2;
  if (paVar10 == paVar9) {
    local_da8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_da8.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_da8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_da8._M_dataplus._M_p = (pointer)paVar10;
  }
  local_da8._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_da8,::CURRENCY_UNIT_abi_cxx11_._M_dataplus._M_p,
                     ::CURRENCY_UNIT_abi_cxx11_._M_string_length);
  local_d88._M_dataplus._M_p = (pointer)&local_d88.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar7->_M_dataplus)._M_p;
  paVar9 = &pbVar7->field_2;
  if (paVar10 == paVar9) {
    local_d88.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_d88.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_d88.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_d88._M_dataplus._M_p = (pointer)paVar10;
  }
  local_d88._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_d88,"/kvB. As of 0.21, fee_rate is in ");
  local_d68._M_dataplus._M_p = (pointer)&local_d68.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar7->_M_dataplus)._M_p;
  paVar9 = &pbVar7->field_2;
  if (paVar10 == paVar9) {
    local_d68.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_d68.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_d68.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_d68._M_dataplus._M_p = (pointer)paVar10;
  }
  local_d68._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_d68,::CURRENCY_ATOM_abi_cxx11_._M_dataplus._M_p,
                     ::CURRENCY_ATOM_abi_cxx11_._M_string_length);
  local_d48._M_dataplus._M_p = (pointer)&local_d48.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar7->_M_dataplus)._M_p;
  paVar9 = &pbVar7->field_2;
  if (paVar10 == paVar9) {
    local_d48.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_d48.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_d48.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_d48._M_dataplus._M_p = (pointer)paVar10;
  }
  local_d48._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_d48,"/vB.\n");
  local_d28 = &local_d18;
  psVar3 = (size_type *)(pbVar7->_M_dataplus)._M_p;
  paVar10 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3 == paVar10) {
    local_d18 = paVar10->_M_allocated_capacity;
    uStack_d10 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_d18 = paVar10->_M_allocated_capacity;
    local_d28 = psVar3;
  }
  local_d20 = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  local_e48 = &local_e38;
  local_e50 = 0;
  local_e40 = 0;
  local_e38 = 0;
  local_e28._0_8_ = (pointer)0x0;
  local_e28._8_2_ = 0;
  local_e28._10_6_ = 0;
  local_e28._16_2_ = 0;
  local_e28._18_8_ = 0;
  name_01._M_string_length = (size_type)method_name;
  name_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe4b8;
  name_01.field_2._M_allocated_capacity._0_4_ = in_stack_ffffffffffffe4c8;
  name_01.field_2._M_allocated_capacity._4_4_ = iVar6;
  name_01.field_2._8_8_ = in_stack_ffffffffffffe4d0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _1_7_ = in_stack_ffffffffffffe4d9;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _M_first._M_storage._0_1_ = in_stack_ffffffffffffe4d8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe4e0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe4e8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe4f0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffe4f8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe508;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe510;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe518;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe520;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffe528;
  description_09._M_string_length = (size_type)in_stack_ffffffffffffe540;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe538;
  description_09.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe548;
  description_09.field_2._8_8_ = in_stack_ffffffffffffe550;
  opts_01.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe560;
  opts_01._0_8_ = in_stack_ffffffffffffe558;
  opts_01.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe568;
  opts_01.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe570;
  opts_01.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe578;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe580;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe588;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe590;
  opts_01._64_8_ = in_stack_ffffffffffffe598;
  ::RPCArg::RPCArg(&local_a58,name_01,(Type)local_c88,fallback_01,description_09,opts_01);
  local_e70[0] = local_e60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e70,"replaceable","");
  local_19c1 = true;
  ::UniValue::UniValue<bool,_bool,_true>(&local_f28,&local_19c1);
  paVar10 = &local_f28.val.field_2;
  local_ed0._8_8_ = (long)&local_ed0 + 0x18;
  local_ed0._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)(_Uninitialized<RPCArg::Optional,_true>)local_f28.typ
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f28.val._M_dataplus._M_p == paVar10) {
    local_ed0._32_8_ = local_f28.val.field_2._8_8_;
  }
  else {
    local_ed0._8_8_ = local_f28.val._M_dataplus._M_p;
  }
  local_ed0._16_8_ = local_f28.val._M_string_length;
  local_f28.val._M_string_length = 0;
  local_f28.val.field_2._M_local_buf[0] = '\0';
  local_ed0._40_8_ =
       local_f28.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_ed0._48_8_ =
       local_f28.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_ed0._56_8_ =
       local_f28.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_f28.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f28.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f28.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_ed0._64_4_ =
       local_f28.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_ed0._68_4_ =
       local_f28.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_ed0._72_4_ =
       local_f28.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_ed0._76_4_ =
       local_f28.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_ed0._80_8_ =
       local_f28.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_f28.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f28.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f28.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e78 = 2;
  local_f48[0] = local_f38;
  local_f28.val._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f48,
             "Whether the new transaction should still be\nmarked bip-125 replaceable. If true, the sequence numbers in the transaction will\nbe left unchanged from the original. If false, any input sequence numbers in the\noriginal transaction that were less than 0xfffffffe will be increased to 0xfffffffe\nso the new transaction will not be explicitly bip-125 replaceable (though it may\nstill be replaceable in practice, for example if it has unconfirmed ancestors which\nare replaceable).\n"
             ,"");
  local_f88 = &local_f78;
  local_f90 = 0;
  local_f80 = 0;
  local_f78 = 0;
  local_f68._0_8_ = (pointer)0x0;
  local_f68._8_2_ = 0;
  local_f68._10_6_ = 0;
  local_f68._16_2_ = 0;
  local_f68._18_8_ = 0;
  name_02._M_string_length = (size_type)method_name;
  name_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe4b8;
  name_02.field_2._M_allocated_capacity._0_4_ = in_stack_ffffffffffffe4c8;
  name_02.field_2._M_allocated_capacity._4_4_ = iVar6;
  name_02.field_2._8_8_ = in_stack_ffffffffffffe4d0;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _1_7_ = in_stack_ffffffffffffe4d9;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _M_first._M_storage._0_1_ = in_stack_ffffffffffffe4d8;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe4e0;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe4e8;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe4f0;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffe4f8;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe508;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe510;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe518;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe520;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffe528;
  description_10._M_string_length = (size_type)in_stack_ffffffffffffe540;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe538;
  description_10.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe548;
  description_10.field_2._8_8_ = in_stack_ffffffffffffe550;
  opts_02.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe560;
  opts_02._0_8_ = in_stack_ffffffffffffe558;
  opts_02.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe568;
  opts_02.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe570;
  opts_02.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe578;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe580;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe588;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe590;
  opts_02._64_8_ = in_stack_ffffffffffffe598;
  ::RPCArg::RPCArg(&local_950,name_02,(Type)local_e70,fallback_02,description_10,opts_02);
  local_fb0[0] = local_fa0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_fb0,"estimate_mode","");
  ::UniValue::UniValue<const_char_(&)[6],_char[6],_true>(&local_1068,(char (*) [6])"unset");
  paVar10 = &local_1068.val.field_2;
  local_1010._8_8_ = (long)&local_1010 + 0x18;
  local_1010._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)
       (_Uninitialized<RPCArg::Optional,_true>)local_1068.typ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1068.val._M_dataplus._M_p == paVar10) {
    local_1010._32_8_ = local_1068.val.field_2._8_8_;
  }
  else {
    local_1010._8_8_ = local_1068.val._M_dataplus._M_p;
  }
  local_1010._16_8_ = local_1068.val._M_string_length;
  local_1068.val._M_string_length = 0;
  local_1068.val.field_2._M_local_buf[0] = '\0';
  local_1010._40_8_ =
       local_1068.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1010._48_8_ =
       local_1068.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1010._56_8_ =
       local_1068.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1068.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1068.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1068.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1010._64_4_ =
       local_1068.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_1010._68_4_ =
       local_1068.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_1010._72_4_ =
       local_1068.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_1010._76_4_ =
       local_1068.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_1010._80_8_ =
       local_1068.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_1068.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1068.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1068.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_fb8 = 2;
  local_10c8[0] = local_10b8;
  local_1068.val._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_10c8,
             "economical mode is used if the transaction is replaceable;\notherwise, conservative mode is used"
             ,"");
  default_info._M_string_length = (size_type)method_name;
  default_info._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe4b8;
  default_info.field_2._M_allocated_capacity._0_4_ = in_stack_ffffffffffffe4c8;
  default_info.field_2._M_allocated_capacity._4_4_ = iVar6;
  default_info.field_2._8_8_ = in_stack_ffffffffffffe4d0;
  common::FeeModesDetail(&local_10a8,default_info);
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_10a8,0,0,"The fee estimate mode, must be one of (case insensitive):\n",
                      0x3a);
  local_1088 = &local_1078;
  psVar3 = (size_type *)(pbVar7->_M_dataplus)._M_p;
  paVar10 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3 == paVar10) {
    local_1078 = paVar10->_M_allocated_capacity;
    uStack_1070 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_1078 = paVar10->_M_allocated_capacity;
    local_1088 = psVar3;
  }
  local_1080 = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  local_1108 = &local_10f8;
  local_1110 = 0;
  local_1100 = 0;
  local_10f8 = 0;
  local_10e8._0_8_ = (pointer)0x0;
  local_10e8._8_2_ = 0;
  local_10e8._10_6_ = 0;
  local_10e8._16_2_ = 0;
  local_10e8._18_8_ = 0;
  name_03._M_string_length = (size_type)method_name;
  name_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe4b8;
  name_03.field_2._M_allocated_capacity._0_4_ = in_stack_ffffffffffffe4c8;
  name_03.field_2._M_allocated_capacity._4_4_ = iVar6;
  name_03.field_2._8_8_ = in_stack_ffffffffffffe4d0;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _1_7_ = in_stack_ffffffffffffe4d9;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _M_first._M_storage._0_1_ = in_stack_ffffffffffffe4d8;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe4e0;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe4e8;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe4f0;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffe4f8;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe508;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe510;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe518;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe520;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffe528;
  description_11._M_string_length = (size_type)in_stack_ffffffffffffe540;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe538;
  description_11.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe548;
  description_11.field_2._8_8_ = in_stack_ffffffffffffe550;
  opts_03.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe560;
  opts_03._0_8_ = in_stack_ffffffffffffe558;
  opts_03.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe568;
  opts_03.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe570;
  opts_03.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe578;
  opts_03.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe580;
  opts_03.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe588;
  opts_03.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe590;
  opts_03._64_8_ = in_stack_ffffffffffffe598;
  ::RPCArg::RPCArg(&local_848,name_03,(Type)local_fb0,fallback_03,description_11,opts_03);
  local_1130[0] = local_1120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1130,"outputs","");
  local_1208 = &local_11f8;
  local_11e0 = &local_11d0;
  local_11e8 = 2;
  local_1190._24_8_ = (ulong)uStack_11f7 << 8;
  uStack_11c8 = uStack_11f0;
  local_1200 = 0;
  local_11f8 = 0;
  local_1190._8_8_ = (long)&local_1190 + 0x18;
  local_1190._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)2;
  local_1190._32_8_ = uStack_11f0;
  local_1190._16_8_ = 0;
  local_11d8 = 0;
  local_11d0 = (ulong)uStack_11f7 << 8;
  local_1190._40_8_ = 0;
  local_1190._48_8_ = 0;
  local_1190._56_8_ = 0;
  local_11c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_11c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_11c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1190._80_8_ = 0;
  local_1190._64_8_ = 0;
  local_1190._72_8_ = 0;
  local_11a8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_11a8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_11a8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_1138 = 2;
  local_1228[0] = local_1218;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1228,
             "The outputs specified as key-value pairs.\nEach key may only appear once, i.e. there can only be one \'data\' output, and no address may be duplicated.\nAt least one output of either type must be specified.\nCannot be provided if \'original_change_index\' is specified."
             ,"");
  OutputsDoc();
  local_1268 = &local_1258;
  local_1270[0] = 1;
  local_1260 = 0;
  local_1258 = 0;
  local_1248._0_8_ = (pointer)0x0;
  local_1248._8_2_ = 0;
  local_1248._10_6_ = 0;
  local_1248._16_2_ = 0;
  local_1248._18_8_ = 0;
  puVar17 = local_1270;
  name_04._M_string_length = (size_type)method_name;
  name_04._M_dataplus._M_p = puVar17;
  name_04.field_2._M_allocated_capacity._0_4_ = in_stack_ffffffffffffe4c8;
  name_04.field_2._M_allocated_capacity._4_4_ = iVar6;
  name_04.field_2._8_8_ = in_stack_ffffffffffffe4d0;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _1_7_ = in_stack_ffffffffffffe4d9;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _M_first._M_storage._0_1_ = in_stack_ffffffffffffe4d8;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe4e0;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe4e8;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe4f0;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffe4f8;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe508;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe510;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe518;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe520;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffe528;
  description_12._M_string_length = (size_type)in_stack_ffffffffffffe540;
  description_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe538;
  description_12.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe548;
  description_12.field_2._8_8_ = in_stack_ffffffffffffe550;
  inner_06.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffe560;
  inner_06.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffe558;
  inner_06.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffe568;
  ::RPCArg::RPCArg(&local_740,name_04,(Type)local_1130,fallback_04,description_12,inner_06,
                   (RPCArgOptions *)0x1);
  local_1290[0] = local_1280;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1290,"original_change_index","");
  local_1310 = &local_1300;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1310,"not set, detect change automatically","");
  local_12f0._0_8_ = (long)&local_12f0 + 0x10;
  if (local_1310 == &local_1300) {
    local_12f0._24_4_ = uStack_12f8;
    local_12f0._28_4_ = uStack_12f4;
  }
  else {
    local_12f0._0_8_ = local_1310;
  }
  local_12f0._8_8_ = local_1308;
  local_1308 = 0;
  local_1300 = local_1300 & 0xffffff00;
  local_1298 = 1;
  local_1330[0] = local_1320;
  local_1310 = &local_1300;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1330,anon_var_dwarf_25a2723,anon_var_dwarf_25a2723 + 0x1be);
  local_1370 = &local_1360;
  local_1378 = 0;
  local_1368 = 0;
  local_1360 = 0;
  local_1350._0_8_ = (pointer)0x0;
  local_1350._8_2_ = 0;
  local_1350._10_6_ = 0;
  local_1350._16_2_ = 0;
  local_1350._18_8_ = 0;
  name_05._M_string_length = (size_type)method_name;
  name_05._M_dataplus._M_p = puVar17;
  name_05.field_2._M_allocated_capacity._0_4_ = in_stack_ffffffffffffe4c8;
  name_05.field_2._M_allocated_capacity._4_4_ = iVar6;
  name_05.field_2._8_8_ = in_stack_ffffffffffffe4d0;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _1_7_ = in_stack_ffffffffffffe4d9;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _M_first._M_storage._0_1_ = in_stack_ffffffffffffe4d8;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe4e0;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe4e8;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe4f0;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffe4f8;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe508;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe510;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe518;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe520;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffe528;
  description_13._M_string_length = (size_type)in_stack_ffffffffffffe540;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe538;
  description_13.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe548;
  description_13.field_2._8_8_ = in_stack_ffffffffffffe550;
  opts_04.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe560;
  opts_04._0_8_ = in_stack_ffffffffffffe558;
  opts_04.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe568;
  opts_04.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe570;
  opts_04.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe578;
  opts_04.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe580;
  opts_04.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe588;
  opts_04.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe590;
  opts_04._64_8_ = in_stack_ffffffffffffe598;
  ::RPCArg::RPCArg(&local_638,name_05,(Type)local_1290,fallback_05,description_13,opts_04);
  __l._M_len = 6;
  __l._M_array = (iterator)local_b60;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_19c0,__l,&local_19e1);
  local_13c0[0] = 0;
  local_13b8[0] = local_13a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_13b8,"options","");
  puVar17 = local_13c0;
  local_1398._16_2_ = 0;
  local_1398._18_8_ = 0;
  local_1398._0_8_ = (pointer)0x0;
  local_1398._8_2_ = 0;
  local_1398._10_6_ = 0;
  name_06._M_string_length = (size_type)method_name;
  name_06._M_dataplus._M_p = puVar17;
  name_06.field_2._M_allocated_capacity._0_4_ = in_stack_ffffffffffffe4c8;
  name_06.field_2._M_allocated_capacity._4_4_ = iVar6;
  name_06.field_2._8_8_ = in_stack_ffffffffffffe4d0;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _1_7_ = in_stack_ffffffffffffe4d9;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _M_first._M_storage._0_1_ = in_stack_ffffffffffffe4d8;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe4e0;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe4e8;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe4f0;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffe4f8;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe508;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe510;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe518;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe520;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffe528;
  description_14._M_string_length = (size_type)in_stack_ffffffffffffe540;
  description_14._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe538;
  description_14.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe548;
  description_14.field_2._8_8_ = in_stack_ffffffffffffe550;
  inner_07.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffe560;
  inner_07.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffe558;
  inner_07.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffe568;
  ::RPCArg::RPCArg(&local_2a0,name_06,(Type)local_4b0,fallback_06,description_14,inner_07,
                   (RPCArgOptions *)0x5);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_3a8;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_19a8,__l_00,&local_19e2);
  local_1468[0] = local_1458;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1468,"");
  local_1488[0] = local_1478;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1488,"");
  if (iVar6 == 0) {
    local_1530[0] = local_1520;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1530,"psbt","");
    local_1550[0] = local_1540;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1550,"The base64-encoded unsigned PSBT of the new transaction.","");
    local_1a58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    m_key_name_00._M_string_length = (size_type)method_name;
    m_key_name_00._M_dataplus._M_p = puVar17;
    m_key_name_00.field_2._M_allocated_capacity._0_4_ = in_stack_ffffffffffffe4c8;
    m_key_name_00.field_2._M_allocated_capacity._4_4_ = iVar6;
    m_key_name_00.field_2._8_8_ = in_stack_ffffffffffffe4d0;
    description_00._M_dataplus._M_p._1_7_ = in_stack_ffffffffffffe4d9;
    description_00._M_dataplus._M_p._0_1_ = in_stack_ffffffffffffe4d8;
    description_00._M_string_length = in_stack_ffffffffffffe4e0;
    description_00.field_2._M_allocated_capacity = in_stack_ffffffffffffe4e8;
    description_00.field_2._8_8_ = in_stack_ffffffffffffe4f0;
    inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffe508;
    inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe4f8._0_8_;
    inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe4f8._8_8_;
    ::RPCResult::RPCResult
              (&local_1510,STR,m_key_name_00,description_00,inner_00,SUB81(local_1530,0));
    __l_02._M_len = 1;
    __l_02._M_array = &local_1510;
    std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_1a38,__l_02,&local_1a59);
  }
  else {
    local_1570[0] = local_1560;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1570,"txid","");
    local_1590[0] = local_1580;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1590,"The id of the new transaction.","");
    m_key_name._M_string_length = (size_type)method_name;
    m_key_name._M_dataplus._M_p = puVar17;
    m_key_name.field_2._M_allocated_capacity._0_4_ = in_stack_ffffffffffffe4c8;
    m_key_name.field_2._M_allocated_capacity._4_4_ = iVar6;
    m_key_name.field_2._8_8_ = in_stack_ffffffffffffe4d0;
    description._M_dataplus._M_p._1_7_ = in_stack_ffffffffffffe4d9;
    description._M_dataplus._M_p._0_1_ = in_stack_ffffffffffffe4d8;
    description._M_string_length = in_stack_ffffffffffffe4e0;
    description.field_2._M_allocated_capacity = in_stack_ffffffffffffe4e8;
    description.field_2._8_8_ = in_stack_ffffffffffffe4f0;
    inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = in_stack_ffffffffffffe508;
    inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)in_stack_ffffffffffffe4f8._0_8_;
    inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)in_stack_ffffffffffffe4f8._8_8_;
    ::RPCResult::RPCResult(&local_1510,STR_HEX,m_key_name,description,inner,SUB81(local_1570,0));
    __l_01._M_len = 1;
    __l_01._M_array = &local_1510;
    std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_1a38,__l_01,&local_1a59);
  }
  local_1748[0] = (pointer)local_1738;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1748,"origfee","");
  local_1768[0] = local_1758;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1768,"The fee of the replaced transaction.","");
  m_key_name_01._M_string_length = (size_type)method_name;
  m_key_name_01._M_dataplus._M_p = puVar17;
  m_key_name_01.field_2._M_allocated_capacity._0_4_ = in_stack_ffffffffffffe4c8;
  m_key_name_01.field_2._M_allocated_capacity._4_4_ = iVar6;
  m_key_name_01.field_2._8_8_ = in_stack_ffffffffffffe4d0;
  description_01._M_dataplus._M_p._1_7_ = in_stack_ffffffffffffe4d9;
  description_01._M_dataplus._M_p._0_1_ = in_stack_ffffffffffffe4d8;
  description_01._M_string_length = in_stack_ffffffffffffe4e0;
  description_01.field_2._M_allocated_capacity = in_stack_ffffffffffffe4e8;
  description_01.field_2._8_8_ = in_stack_ffffffffffffe4f0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe508;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe4f8._0_8_;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe4f8._8_8_;
  ::RPCResult::RPCResult
            ((RPCResult *)(local_1738 + 0x10),STR_AMOUNT,m_key_name_01,description_01,inner_01,
             SUB81(local_1748,0));
  local_1788.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_1788.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1788,"fee","");
  local_17a8[0] = local_1798;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_17a8,"The fee of the new transaction.","");
  pRVar23 = (pointer)0x0;
  pRVar24 = (pointer)0x0;
  m_key_name_02._M_string_length = (size_type)method_name;
  m_key_name_02._M_dataplus._M_p = puVar17;
  m_key_name_02.field_2._M_allocated_capacity._0_4_ = in_stack_ffffffffffffe4c8;
  m_key_name_02.field_2._M_allocated_capacity._4_4_ = iVar6;
  m_key_name_02.field_2._8_8_ = in_stack_ffffffffffffe4d0;
  description_02._M_dataplus._M_p._1_7_ = in_stack_ffffffffffffe4d9;
  description_02._M_dataplus._M_p._0_1_ = in_stack_ffffffffffffe4d8;
  description_02._M_string_length = in_stack_ffffffffffffe4e0;
  description_02.field_2._M_allocated_capacity = in_stack_ffffffffffffe4e8;
  description_02.field_2._8_8_ = in_stack_ffffffffffffe4f0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe508;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe4f8._0_8_;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe4f8._8_8_;
  ::RPCResult::RPCResult
            (&local_16a0,STR_AMOUNT,m_key_name_02,description_02,inner_02,SUB81(&local_1788,0));
  local_17c8[0] = local_17b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_17c8,"errors","");
  local_17e8[0] = local_17d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_17e8,"Errors encountered during processing (may be empty).","");
  local_1890[0] = local_1880;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1890,"");
  local_18b0[0] = local_18a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_18b0,"");
  pRVar20 = (pointer)0x0;
  pRVar21 = (pointer)0x0;
  pRVar22 = (pointer)0x0;
  m_key_name_03._M_string_length = (size_type)method_name;
  m_key_name_03._M_dataplus._M_p = puVar17;
  m_key_name_03.field_2._M_allocated_capacity._0_4_ = in_stack_ffffffffffffe4c8;
  m_key_name_03.field_2._M_allocated_capacity._4_4_ = iVar6;
  m_key_name_03.field_2._8_8_ = in_stack_ffffffffffffe4d0;
  description_03._M_dataplus._M_p._1_7_ = in_stack_ffffffffffffe4d9;
  description_03._M_dataplus._M_p._0_1_ = in_stack_ffffffffffffe4d8;
  description_03._M_string_length = in_stack_ffffffffffffe4e0;
  description_03.field_2._M_allocated_capacity = in_stack_ffffffffffffe4e8;
  description_03.field_2._8_8_ = in_stack_ffffffffffffe4f0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe4f8._0_8_;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe4f8._8_8_;
  ::RPCResult::RPCResult(&local_1870,STR,m_key_name_03,description_03,inner_03,SUB81(local_1890,0));
  __l_03._M_len = 1;
  __l_03._M_array = &local_1870;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe520,__l_03,
             (allocator_type *)&stack0xffffffffffffe507);
  m_key_name_04._M_string_length = (size_type)method_name;
  m_key_name_04._M_dataplus._M_p = puVar17;
  m_key_name_04.field_2._M_allocated_capacity._0_4_ = in_stack_ffffffffffffe4c8;
  m_key_name_04.field_2._M_allocated_capacity._4_4_ = iVar6;
  m_key_name_04.field_2._8_8_ = in_stack_ffffffffffffe4d0;
  description_04._M_dataplus._M_p._1_7_ = in_stack_ffffffffffffe4d9;
  description_04._M_dataplus._M_p._0_1_ = in_stack_ffffffffffffe4d8;
  description_04._M_string_length = in_stack_ffffffffffffe4e0;
  description_04.field_2._M_allocated_capacity = in_stack_ffffffffffffe4e8;
  description_04.field_2._8_8_ = in_stack_ffffffffffffe4f0;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar20;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe4f8._0_8_;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe4f8._8_8_;
  ::RPCResult::RPCResult(&local_1618,ARR,m_key_name_04,description_04,inner_04,SUB81(local_17c8,0));
  __l_04._M_len = 3;
  __l_04._M_array = (iterator)(local_1738 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe570,__l_04,
             (allocator_type *)&stack0xffffffffffffe506);
  uVar18 = CONCAT13(bVar16,(int3)in_stack_ffffffffffffe4c8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::reserve
            (&local_1a38,
             ((long)in_stack_ffffffffffffe578 - (long)in_stack_ffffffffffffe570 >> 3) *
             -0xf0f0f0f0f0f0f0f +
             ((long)local_1a38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_1a38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0xf0f0f0f0f0f0f0f);
  if (in_stack_ffffffffffffe570 != in_stack_ffffffffffffe578) {
    do {
      std::vector<RPCResult,_std::allocator<RPCResult>_>::emplace_back<RPCResult>
                (&local_1a38,in_stack_ffffffffffffe570);
      in_stack_ffffffffffffe570 = in_stack_ffffffffffffe570 + 1;
    } while (in_stack_ffffffffffffe570 != in_stack_ffffffffffffe578);
  }
  local_1a18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_1a38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_1a18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_1a38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1a18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_1a38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_1a38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_05._M_string_length = (size_type)method_name;
  m_key_name_05._M_dataplus._M_p = puVar17;
  m_key_name_05.field_2._M_allocated_capacity._0_4_ = uVar18;
  m_key_name_05.field_2._M_allocated_capacity._4_4_ = iVar6;
  m_key_name_05.field_2._8_8_ = __return_storage_ptr__;
  description_05._M_dataplus._M_p._1_7_ = in_stack_ffffffffffffe4d9;
  description_05._M_dataplus._M_p._0_1_ = in_stack_ffffffffffffe4d8;
  description_05._M_string_length = in_stack_ffffffffffffe4e0;
  description_05.field_2._M_allocated_capacity = in_stack_ffffffffffffe4e8;
  description_05.field_2._8_8_ = in_stack_ffffffffffffe4f0;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar20;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe4f8._0_8_;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe4f8._8_8_;
  ::RPCResult::RPCResult(&local_1448,OBJ,m_key_name_05,description_05,inner_05,SUB81(local_1468,0));
  result.m_key_name._M_dataplus._M_p = (pointer)method_name;
  result._0_8_ = puVar17;
  result.m_key_name._M_string_length._0_4_ = uVar18;
  result.m_key_name._M_string_length._4_4_ = iVar6;
  result.m_key_name.field_2._M_allocated_capacity = (size_type)__return_storage_ptr__;
  result.m_key_name.field_2._M_local_buf[8] = in_stack_ffffffffffffe4d8;
  result.m_key_name.field_2._9_7_ = in_stack_ffffffffffffe4d9;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe4e0;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe4e8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe4f0;
  result.m_optional = (bool)in_stack_ffffffffffffe4f8[0];
  result.m_skip_type_check = (bool)in_stack_ffffffffffffe4f8[1];
  result._66_6_ = in_stack_ffffffffffffe4f8._2_6_;
  result.m_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe4f8._8_8_;
  result.m_description._M_string_length = (size_type)pRVar20;
  result.m_description.field_2._M_allocated_capacity = (size_type)pRVar21;
  result.m_description.field_2._8_8_ = pRVar22;
  result.m_cond._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe520;
  result.m_cond._8_16_ = in_stack_ffffffffffffe528;
  result.m_cond.field_2._8_8_ = pRVar23;
  RPCResults::RPCResults(&local_1a00,result);
  pcVar12 = "txid";
  if (iVar6 == 0) {
    pcVar12 = "psbt";
  }
  pcVar11 = "";
  if (iVar6 == 0) {
    pcVar11 = "";
  }
  local_1950._M_dataplus._M_p = (pointer)&local_1950.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1950,pcVar12,pcVar11);
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_1950,0,0,"\nBump the fee, get the new transaction\'s ",0x29);
  local_1930._M_dataplus._M_p = (pointer)&local_1930.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar7->_M_dataplus)._M_p;
  paVar9 = &pbVar7->field_2;
  if (paVar10 == paVar9) {
    local_1930.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_1930.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_1930.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_1930._M_dataplus._M_p = (pointer)paVar10;
  }
  local_1930._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_1930,"\n");
  local_1910._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
  paVar10 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1910._M_dataplus._M_p == paVar10) {
    local_1910.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_1910.field_2._8_4_ = *(undefined4 *)((long)&pbVar7->field_2 + 8);
    local_1910.field_2._12_4_ = *(undefined4 *)((long)&pbVar7->field_2 + 0xc);
    local_1910._M_dataplus._M_p = (pointer)&local_1910.field_2;
  }
  else {
    local_1910.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_1910._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  local_1990._M_dataplus._M_p = (pointer)&local_1990.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1990,"<txid>","");
  HelpExampleCli(&local_1970,method_name,&local_1990);
  uVar13 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1910._M_dataplus._M_p != &local_1910.field_2) {
    uVar13 = local_1910.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar13 < local_1970._M_string_length + local_1910._M_string_length) {
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1970._M_dataplus._M_p != &local_1970.field_2) {
      uVar13 = local_1970.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar13 < local_1970._M_string_length + local_1910._M_string_length)
    goto LAB_0060c2ad;
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_1970,0,0,local_1910._M_dataplus._M_p,local_1910._M_string_length);
  }
  else {
LAB_0060c2ad:
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_1910,local_1970._M_dataplus._M_p,local_1970._M_string_length);
  }
  local_18f0 = &local_18e0;
  puVar4 = (ulong *)(pbVar7->_M_dataplus)._M_p;
  paVar10 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar4 == paVar10) {
    local_18e0 = paVar10->_M_allocated_capacity;
    uStack_18d8 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_18e0 = paVar10->_M_allocated_capacity;
    local_18f0 = puVar4;
  }
  local_18c8 = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar7->_M_string_length = 0;
  paVar10->_M_local_buf[0] = '\0';
  if (local_18f0 == &local_18e0) {
    uStack_18b8 = uStack_18d8;
    local_18d0 = &local_18c0;
  }
  else {
    local_18d0 = local_18f0;
  }
  local_18c0 = local_18e0;
  local_18e8 = 0;
  local_18e0 = local_18e0 & 0xffffffffffffff00;
  pcVar19 = std::
            _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/spend.cpp:1056:9)>
            ::_M_manager;
  name_07._M_string_length = (size_type)method_name;
  name_07._M_dataplus._M_p = &stack0xffffffffffffe4d8;
  name_07.field_2._M_allocated_capacity._0_4_ = uVar18;
  name_07.field_2._M_allocated_capacity._4_4_ = iVar6;
  name_07.field_2._8_8_ = __return_storage_ptr__;
  auVar5 = ZEXT116((byte)((uint)uVar18 >> 0x18));
  description_06.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/spend.cpp:1056:9)>
       ::_M_manager;
  description_06._M_dataplus._M_p = (pointer)auVar5._0_8_;
  description_06._M_string_length = auVar5._8_8_;
  description_06.field_2._8_8_ =
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/spend.cpp:1056:9)>
       ::_M_invoke;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar20;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)in_stack_ffffffffffffe4f8._0_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)in_stack_ffffffffffffe4f8._8_8_;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar22;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = pRVar21;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffe520;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar23;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe528._0_8_;
  examples.m_examples._M_string_length = in_stack_ffffffffffffe528._8_8_;
  examples.m_examples.field_2._8_8_ = pRVar24;
  local_18f0 = &local_18e0;
  RPCHelpMan::RPCHelpMan
            (__return_storage_ptr__,name_07,description_06,args,results,examples,
             (RPCMethodImpl *)&local_78);
  if (pcVar19 != (code *)0x0) {
    (*pcVar19)(&stack0xffffffffffffe4d8,&stack0xffffffffffffe4d8,3);
  }
  if (local_18d0 != &local_18c0) {
    operator_delete(local_18d0,local_18c0 + 1);
  }
  if (local_18f0 != &local_18e0) {
    operator_delete(local_18f0,local_18e0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1970._M_dataplus._M_p != &local_1970.field_2) {
    operator_delete(local_1970._M_dataplus._M_p,local_1970.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1990._M_dataplus._M_p != &local_1990.field_2) {
    operator_delete(local_1990._M_dataplus._M_p,local_1990.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1910._M_dataplus._M_p != &local_1910.field_2) {
    operator_delete(local_1910._M_dataplus._M_p,local_1910.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1930._M_dataplus._M_p != &local_1930.field_2) {
    operator_delete(local_1930._M_dataplus._M_p,local_1930.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1950._M_dataplus._M_p != &local_1950.field_2) {
    operator_delete(local_1950._M_dataplus._M_p,local_1950.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1a00.m_results);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1448.m_cond._M_dataplus._M_p != &local_1448.m_cond.field_2) {
    operator_delete(local_1448.m_cond._M_dataplus._M_p,
                    local_1448.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1448.m_description._M_dataplus._M_p != &local_1448.m_description.field_2) {
    operator_delete(local_1448.m_description._M_dataplus._M_p,
                    local_1448.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1448.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1448.m_key_name._M_dataplus._M_p != &local_1448.m_key_name.field_2) {
    operator_delete(local_1448.m_key_name._M_dataplus._M_p,
                    local_1448.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1a18);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe570);
  lVar15 = 0x198;
  do {
    if ((long *)(local_1738 + lVar15) != *(long **)((long)local_1748 + lVar15)) {
      operator_delete(*(long **)((long)local_1748 + lVar15),*(long *)(local_1738 + lVar15) + 1);
    }
    if ((long *)((long)local_1758 + lVar15) != *(long **)((long)local_1768 + lVar15)) {
      operator_delete(*(long **)((long)local_1768 + lVar15),*(long *)((long)local_1758 + lVar15) + 1
                     );
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_1788.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + lVar15));
    if ((long *)((long)local_1798 + lVar15) != *(long **)((long)local_17a8 + lVar15)) {
      operator_delete(*(long **)((long)local_17a8 + lVar15),*(long *)((long)local_1798 + lVar15) + 1
                     );
    }
    lVar15 = lVar15 + -0x88;
  } while (lVar15 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe520);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1870.m_cond._M_dataplus._M_p != &local_1870.m_cond.field_2) {
    operator_delete(local_1870.m_cond._M_dataplus._M_p,
                    local_1870.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1870.m_description._M_dataplus._M_p != &local_1870.m_description.field_2) {
    operator_delete(local_1870.m_description._M_dataplus._M_p,
                    local_1870.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1870.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1870.m_key_name._M_dataplus._M_p != &local_1870.m_key_name.field_2) {
    operator_delete(local_1870.m_key_name._M_dataplus._M_p,
                    local_1870.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe508);
  if (local_18b0[0] != local_18a0) {
    operator_delete(local_18b0[0],local_18a0[0] + 1);
  }
  if (local_1890[0] != local_1880) {
    operator_delete(local_1890[0],local_1880[0] + 1);
  }
  if (local_17e8[0] != local_17d8) {
    operator_delete(local_17e8[0],local_17d8[0] + 1);
  }
  if (local_17c8[0] != local_17b8) {
    operator_delete(local_17c8[0],local_17b8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe538);
  if (local_17a8[0] != local_1798) {
    operator_delete(local_17a8[0],local_1798[0] + 1);
  }
  if (local_1788.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_1788.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + 0x10U)) {
    operator_delete(local_1788.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_1788.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe558);
  if (local_1768[0] != local_1758) {
    operator_delete(local_1768[0],local_1758[0] + 1);
  }
  if (local_1748[0] != (pointer)local_1738) {
    operator_delete(local_1748[0],local_1738._0_8_ + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1a38);
  paVar10 = &local_1510.m_cond.field_2;
  if (iVar6 == 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1510.m_cond._M_dataplus._M_p != paVar10) {
      operator_delete(local_1510.m_cond._M_dataplus._M_p,
                      local_1510.m_cond.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1510.m_description._M_dataplus._M_p != &local_1510.m_description.field_2) {
      operator_delete(local_1510.m_description._M_dataplus._M_p,
                      local_1510.m_description.field_2._M_allocated_capacity + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1510.m_inner);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1510.m_key_name._M_dataplus._M_p != &local_1510.m_key_name.field_2) {
      operator_delete(local_1510.m_key_name._M_dataplus._M_p,
                      local_1510.m_key_name.field_2._M_allocated_capacity + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1a58);
    if (local_1550[0] != local_1540) {
      operator_delete(local_1550[0],local_1540[0] + 1);
    }
    plVar14 = local_1530[0];
    if (local_1530[0] == local_1520) goto LAB_0060c98e;
  }
  else {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1510.m_cond._M_dataplus._M_p != paVar10) {
      operator_delete(local_1510.m_cond._M_dataplus._M_p,
                      local_1510.m_cond.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1510.m_description._M_dataplus._M_p != &local_1510.m_description.field_2) {
      operator_delete(local_1510.m_description._M_dataplus._M_p,
                      local_1510.m_description.field_2._M_allocated_capacity + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1510.m_inner);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1510.m_key_name._M_dataplus._M_p != &local_1510.m_key_name.field_2) {
      operator_delete(local_1510.m_key_name._M_dataplus._M_p,
                      local_1510.m_key_name.field_2._M_allocated_capacity + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe588);
    if (local_1590[0] != local_1580) {
      operator_delete(local_1590[0],local_1580[0] + 1);
    }
    local_1520[0] = local_1560[0];
    plVar14 = local_1570[0];
    if (local_1570[0] == local_1560) goto LAB_0060c98e;
  }
  operator_delete(plVar14,local_1520[0] + 1);
LAB_0060c98e:
  if (local_1488[0] != local_1478) {
    operator_delete(local_1488[0],local_1478[0] + 1);
  }
  if (local_1468[0] != local_1458) {
    operator_delete(local_1468[0],local_1458[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_19a8);
  lVar15 = 0x210;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_3c8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar15));
    plVar14 = *(long **)((long)&local_428 + lVar15 + 0x40);
    plVar8 = (long *)((long)&local_428 + lVar15 + 0x50);
    if (plVar8 != plVar14) {
      operator_delete(plVar14,*plVar8 + 1);
    }
    plVar8 = (long *)((long)&local_428 + lVar15 + 0x28);
    plVar14 = *(long **)((long)&local_428 + lVar15 + 0x18);
    if (plVar8 != plVar14) {
      operator_delete(plVar14,*plVar8 + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(auStack_470 + lVar15));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)
               ((long)&local_488.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl +
               lVar15));
    if ((long *)((long)local_4a0 + lVar15) != *(long **)((long)local_4b0 + lVar15)) {
      operator_delete(*(long **)((long)local_4b0 + lVar15),*(long *)((long)local_4a0 + lVar15) + 1);
    }
    lVar15 = lVar15 + -0x108;
  } while (lVar15 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1398);
  if (local_13b8[0] != local_13a8) {
    operator_delete(local_13b8[0],local_13a8[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_19c0);
  lVar15 = 0x630;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_b80.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar15));
    plVar14 = *(long **)((long)&local_be0 + lVar15 + 0x40);
    plVar8 = (long *)((long)&local_be0 + lVar15 + 0x50);
    if (plVar8 != plVar14) {
      operator_delete(plVar14,*plVar8 + 1);
    }
    plVar8 = (long *)((long)&local_be0 + lVar15 + 0x28);
    plVar14 = *(long **)((long)&local_be0 + lVar15 + 0x18);
    if (plVar8 != plVar14) {
      operator_delete(plVar14,*plVar8 + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(auStack_c28 + lVar15));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)(local_c40 + lVar15));
    if ((long *)((long)&local_c58 + lVar15) != *(long **)(local_c68 + lVar15)) {
      operator_delete(*(long **)(local_c68 + lVar15),*(long *)((long)&local_c58 + lVar15) + 1);
    }
    lVar15 = lVar15 + -0x108;
  } while (lVar15 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1350);
  if (local_1370 != &local_1360) {
    operator_delete(local_1370,CONCAT71(uStack_135f,local_1360) + 1);
  }
  if (local_1330[0] != local_1320) {
    operator_delete(local_1330[0],local_1320[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_12f0._M_first);
  if (local_1310 != &local_1300) {
    operator_delete(local_1310,CONCAT44(uStack_12fc,local_1300) + 1);
  }
  if (local_1290[0] != local_1280) {
    operator_delete(local_1290[0],local_1280[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1248);
  if (local_1268 != &local_1258) {
    operator_delete(local_1268,CONCAT71(uStack_1257,local_1258) + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_19e0);
  if (local_1228[0] != local_1218) {
    operator_delete(local_1228[0],local_1218[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_1190._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_11a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_11c0);
  if (local_11e0 != &local_11d0) {
    operator_delete(local_11e0,local_11d0 + 1);
  }
  if (local_1208 != &local_11f8) {
    operator_delete(local_1208,CONCAT71(uStack_11f7,local_11f8) + 1);
  }
  if (local_1130[0] != local_1120) {
    operator_delete(local_1130[0],local_1120[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_10e8);
  if (local_1108 != &local_10f8) {
    operator_delete(local_1108,CONCAT71(uStack_10f7,local_10f8) + 1);
  }
  if (local_1088 != &local_1078) {
    operator_delete(local_1088,local_1078 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10a8._M_dataplus._M_p != &local_10a8.field_2) {
    operator_delete(local_10a8._M_dataplus._M_p,local_10a8.field_2._M_allocated_capacity + 1);
  }
  if (local_10c8[0] != local_10b8) {
    operator_delete(local_10c8[0],local_10b8[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_1010._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_1068.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1068.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1068.val._M_dataplus._M_p != &local_1068.val.field_2) {
    operator_delete(local_1068.val._M_dataplus._M_p,
                    CONCAT71(local_1068.val.field_2._M_allocated_capacity._1_7_,
                             local_1068.val.field_2._M_local_buf[0]) + 1);
  }
  if (local_fb0[0] != local_fa0) {
    operator_delete(local_fb0[0],local_fa0[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_f68);
  if (local_f88 != &local_f78) {
    operator_delete(local_f88,CONCAT71(uStack_f77,local_f78) + 1);
  }
  if (local_f48[0] != local_f38) {
    operator_delete(local_f48[0],local_f38[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_ed0._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_f28.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f28.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f28.val._M_dataplus._M_p != &local_f28.val.field_2) {
    operator_delete(local_f28.val._M_dataplus._M_p,
                    CONCAT71(local_f28.val.field_2._M_allocated_capacity._1_7_,
                             local_f28.val.field_2._M_local_buf[0]) + 1);
  }
  if (local_e70[0] != local_e60) {
    operator_delete(local_e70[0],local_e60[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_e28);
  if (local_e48 != &local_e38) {
    operator_delete(local_e48,CONCAT71(uStack_e37,local_e38) + 1);
  }
  if (local_d28 != &local_d18) {
    operator_delete(local_d28,local_d18 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d48._M_dataplus._M_p != &local_d48.field_2) {
    operator_delete(local_d48._M_dataplus._M_p,local_d48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d68._M_dataplus._M_p != &local_d68.field_2) {
    operator_delete(local_d68._M_dataplus._M_p,local_d68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d88._M_dataplus._M_p != &local_d88.field_2) {
    operator_delete(local_d88._M_dataplus._M_p,local_d88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_da8._M_dataplus._M_p != &local_da8.field_2) {
    operator_delete(local_da8._M_dataplus._M_p,local_da8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_dc8._M_dataplus._M_p != &local_dc8.field_2) {
    operator_delete(local_dc8._M_dataplus._M_p,local_dc8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_de8._M_dataplus._M_p != &local_de8.field_2) {
    operator_delete(local_de8._M_dataplus._M_p,local_de8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e08._M_dataplus._M_p != &local_e08.field_2) {
    operator_delete(local_e08._M_dataplus._M_p,local_e08.field_2._M_allocated_capacity + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_ce8._M_first);
  if (local_d08 != &local_cf8) {
    operator_delete(local_d08,CONCAT71(uStack_cf7,local_cf8) + 1);
  }
  if (local_c88[0] != local_c78) {
    operator_delete(local_c88[0],local_c78[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_c40);
  if (local_c60 != &local_c50) {
    operator_delete(local_c60,CONCAT71(uStack_c4f,local_c50) + 1);
  }
  if (local_c20 != local_c10) {
    operator_delete(local_c20,local_c10[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_be0._M_first);
  if (local_c00 != &local_bf0) {
    operator_delete(local_c00,CONCAT44(uStack_bec,local_bf0) + 1);
  }
  if (local_b80.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_b80.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_b80.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_b80.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_530[0] != local_520) {
    operator_delete(local_530[0],local_520[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_510._M_first);
  if (local_4b0[0] != local_4a0) {
    operator_delete(local_4b0[0],local_4a0[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_468);
  if (local_488.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      (pointer)((long)&local_488.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + 0x10U
               )) {
    operator_delete(local_488.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT71(local_488.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._1_7_,
                             local_488.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
  }
  if (local_448[0] != local_438) {
    operator_delete(local_448[0],local_438[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_428._M_first);
  if (local_3c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_3c8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_3c8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_3c8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((_Manager_type *)local_78._M_unused._0_8_ != local_68) {
    operator_delete(local_78._M_unused._M_object,(ulong)(local_68[0] + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)incremental_fee._M_dataplus._M_p != &incremental_fee.field_2) {
    operator_delete(incremental_fee._M_dataplus._M_p,
                    incremental_fee.field_2._M_allocated_capacity + 1);
  }
  if (*(RPCHelpMan **)(in_FS_OFFSET + 0x28) != pRVar1) {
    __stack_chk_fail();
  }
  return *(RPCHelpMan **)(in_FS_OFFSET + 0x28);
}

Assistant:

static RPCHelpMan bumpfee_helper(std::string method_name)
{
    const bool want_psbt = method_name == "psbtbumpfee";
    const std::string incremental_fee{CFeeRate(DEFAULT_INCREMENTAL_RELAY_FEE).ToString(FeeEstimateMode::SAT_VB)};

    return RPCHelpMan{method_name,
        "\nBumps the fee of an opt-in-RBF transaction T, replacing it with a new transaction B.\n"
        + std::string(want_psbt ? "Returns a PSBT instead of creating and signing a new transaction.\n" : "") +
        "An opt-in RBF transaction with the given txid must be in the wallet.\n"
        "The command will pay the additional fee by reducing change outputs or adding inputs when necessary.\n"
        "It may add a new change output if one does not already exist.\n"
        "All inputs in the original transaction will be included in the replacement transaction.\n"
        "The command will fail if the wallet or mempool contains a transaction that spends one of T's outputs.\n"
        "By default, the new fee will be calculated automatically using the estimatesmartfee RPC.\n"
        "The user can specify a confirmation target for estimatesmartfee.\n"
        "Alternatively, the user can specify a fee rate in " + CURRENCY_ATOM + "/vB for the new transaction.\n"
        "At a minimum, the new fee rate must be high enough to pay an additional new relay fee (incrementalfee\n"
        "returned by getnetworkinfo) to enter the node's mempool.\n"
        "* WARNING: before version 0.21, fee_rate was in " + CURRENCY_UNIT + "/kvB. As of 0.21, fee_rate is in " + CURRENCY_ATOM + "/vB. *\n",
        {
            {"txid", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "The txid to be bumped"},
            {"options", RPCArg::Type::OBJ_NAMED_PARAMS, RPCArg::Optional::OMITTED, "",
                {
                    {"conf_target", RPCArg::Type::NUM, RPCArg::DefaultHint{"wallet -txconfirmtarget"}, "Confirmation target in blocks\n"},
                    {"fee_rate", RPCArg::Type::AMOUNT, RPCArg::DefaultHint{"not set, fall back to wallet fee estimation"},
                             "\nSpecify a fee rate in " + CURRENCY_ATOM + "/vB instead of relying on the built-in fee estimator.\n"
                             "Must be at least " + incremental_fee + " higher than the current transaction fee rate.\n"
                             "WARNING: before version 0.21, fee_rate was in " + CURRENCY_UNIT + "/kvB. As of 0.21, fee_rate is in " + CURRENCY_ATOM + "/vB.\n"},
                    {"replaceable", RPCArg::Type::BOOL, RPCArg::Default{true}, "Whether the new transaction should still be\n"
                             "marked bip-125 replaceable. If true, the sequence numbers in the transaction will\n"
                             "be left unchanged from the original. If false, any input sequence numbers in the\n"
                             "original transaction that were less than 0xfffffffe will be increased to 0xfffffffe\n"
                             "so the new transaction will not be explicitly bip-125 replaceable (though it may\n"
                             "still be replaceable in practice, for example if it has unconfirmed ancestors which\n"
                             "are replaceable).\n"},
                    {"estimate_mode", RPCArg::Type::STR, RPCArg::Default{"unset"}, "The fee estimate mode, must be one of (case insensitive):\n"
                              + FeeModesDetail(std::string("economical mode is used if the transaction is replaceable;\notherwise, conservative mode is used"))},
                    {"outputs", RPCArg::Type::ARR, RPCArg::Default{UniValue::VARR}, "The outputs specified as key-value pairs.\n"
                             "Each key may only appear once, i.e. there can only be one 'data' output, and no address may be duplicated.\n"
                             "At least one output of either type must be specified.\n"
                             "Cannot be provided if 'original_change_index' is specified.",
                        OutputsDoc(),
                        RPCArgOptions{.skip_type_check = true}},
                    {"original_change_index", RPCArg::Type::NUM, RPCArg::DefaultHint{"not set, detect change automatically"}, "The 0-based index of the change output on the original transaction. "
                                                                                                                            "The indicated output will be recycled into the new change output on the bumped transaction. "
                                                                                                                            "The remainder after paying the recipients and fees will be sent to the output script of the "
                                                                                                                            "original change output. The change output’s amount can increase if bumping the transaction "
                                                                                                                            "adds new inputs, otherwise it will decrease. Cannot be used in combination with the 'outputs' option."},
                },
                RPCArgOptions{.oneline_description="options"}},
        },
        RPCResult{
            RPCResult::Type::OBJ, "", "", Cat(
                want_psbt ?
                std::vector<RPCResult>{{RPCResult::Type::STR, "psbt", "The base64-encoded unsigned PSBT of the new transaction."}} :
                std::vector<RPCResult>{{RPCResult::Type::STR_HEX, "txid", "The id of the new transaction."}},
            {
                {RPCResult::Type::STR_AMOUNT, "origfee", "The fee of the replaced transaction."},
                {RPCResult::Type::STR_AMOUNT, "fee", "The fee of the new transaction."},
                {RPCResult::Type::ARR, "errors", "Errors encountered during processing (may be empty).",
                {
                    {RPCResult::Type::STR, "", ""},
                }},
            })
        },
        RPCExamples{
    "\nBump the fee, get the new transaction\'s " + std::string(want_psbt ? "psbt" : "txid") + "\n" +
            HelpExampleCli(method_name, "<txid>")
        },
        [want_psbt](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    std::shared_ptr<CWallet> const pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    if (pwallet->IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS) && !pwallet->IsWalletFlagSet(WALLET_FLAG_EXTERNAL_SIGNER) && !want_psbt) {
        throw JSONRPCError(RPC_WALLET_ERROR, "bumpfee is not available with wallets that have private keys disabled. Use psbtbumpfee instead.");
    }

    uint256 hash(ParseHashV(request.params[0], "txid"));

    CCoinControl coin_control;
    coin_control.fAllowWatchOnly = pwallet->IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS);
    // optional parameters
    coin_control.m_signal_bip125_rbf = true;
    std::vector<CTxOut> outputs;

    std::optional<uint32_t> original_change_index;

    if (!request.params[1].isNull()) {
        UniValue options = request.params[1];
        RPCTypeCheckObj(options,
            {
                {"confTarget", UniValueType(UniValue::VNUM)},
                {"conf_target", UniValueType(UniValue::VNUM)},
                {"fee_rate", UniValueType()}, // will be checked by AmountFromValue() in SetFeeEstimateMode()
                {"replaceable", UniValueType(UniValue::VBOOL)},
                {"estimate_mode", UniValueType(UniValue::VSTR)},
                {"outputs", UniValueType()}, // will be checked by AddOutputs()
                {"original_change_index", UniValueType(UniValue::VNUM)},
            },
            true, true);

        if (options.exists("confTarget") && options.exists("conf_target")) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "confTarget and conf_target options should not both be set. Use conf_target (confTarget is deprecated).");
        }

        auto conf_target = options.exists("confTarget") ? options["confTarget"] : options["conf_target"];

        if (options.exists("replaceable")) {
            coin_control.m_signal_bip125_rbf = options["replaceable"].get_bool();
        }
        SetFeeEstimateMode(*pwallet, coin_control, conf_target, options["estimate_mode"], options["fee_rate"], /*override_min_fee=*/false);

        // Prepare new outputs by creating a temporary tx and calling AddOutputs().
        if (!options["outputs"].isNull()) {
            if (options["outputs"].isArray() && options["outputs"].empty()) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, output argument cannot be an empty array");
            }
            CMutableTransaction tempTx;
            AddOutputs(tempTx, options["outputs"]);
            outputs = tempTx.vout;
        }

        if (options.exists("original_change_index")) {
            original_change_index = options["original_change_index"].getInt<uint32_t>();
        }
    }

    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    pwallet->BlockUntilSyncedToCurrentChain();

    LOCK(pwallet->cs_wallet);

    EnsureWalletIsUnlocked(*pwallet);


    std::vector<bilingual_str> errors;
    CAmount old_fee;
    CAmount new_fee;
    CMutableTransaction mtx;
    feebumper::Result res;
    // Targeting feerate bump.
    res = feebumper::CreateRateBumpTransaction(*pwallet, hash, coin_control, errors, old_fee, new_fee, mtx, /*require_mine=*/ !want_psbt, outputs, original_change_index);
    if (res != feebumper::Result::OK) {
        switch(res) {
            case feebumper::Result::INVALID_ADDRESS_OR_KEY:
                throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, errors[0].original);
                break;
            case feebumper::Result::INVALID_REQUEST:
                throw JSONRPCError(RPC_INVALID_REQUEST, errors[0].original);
                break;
            case feebumper::Result::INVALID_PARAMETER:
                throw JSONRPCError(RPC_INVALID_PARAMETER, errors[0].original);
                break;
            case feebumper::Result::WALLET_ERROR:
                throw JSONRPCError(RPC_WALLET_ERROR, errors[0].original);
                break;
            default:
                throw JSONRPCError(RPC_MISC_ERROR, errors[0].original);
                break;
        }
    }

    UniValue result(UniValue::VOBJ);

    // For bumpfee, return the new transaction id.
    // For psbtbumpfee, return the base64-encoded unsigned PSBT of the new transaction.
    if (!want_psbt) {
        if (!feebumper::SignTransaction(*pwallet, mtx)) {
            if (pwallet->IsWalletFlagSet(WALLET_FLAG_EXTERNAL_SIGNER)) {
                throw JSONRPCError(RPC_WALLET_ERROR, "Transaction incomplete. Try psbtbumpfee instead.");
            }
            throw JSONRPCError(RPC_WALLET_ERROR, "Can't sign transaction.");
        }

        uint256 txid;
        if (feebumper::CommitTransaction(*pwallet, hash, std::move(mtx), errors, txid) != feebumper::Result::OK) {
            throw JSONRPCError(RPC_WALLET_ERROR, errors[0].original);
        }

        result.pushKV("txid", txid.GetHex());
    } else {
        PartiallySignedTransaction psbtx(mtx);
        bool complete = false;
        const auto err{pwallet->FillPSBT(psbtx, complete, SIGHASH_DEFAULT, /*sign=*/false, /*bip32derivs=*/true)};
        CHECK_NONFATAL(!err);
        CHECK_NONFATAL(!complete);
        DataStream ssTx{};
        ssTx << psbtx;
        result.pushKV("psbt", EncodeBase64(ssTx.str()));
    }

    result.pushKV("origfee", ValueFromAmount(old_fee));
    result.pushKV("fee", ValueFromAmount(new_fee));
    UniValue result_errors(UniValue::VARR);
    for (const bilingual_str& error : errors) {
        result_errors.push_back(error.original);
    }
    result.pushKV("errors", std::move(result_errors));

    return result;
},
    };
}